

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_rc2_test.c
# Opt level: O0

void mpi_rc_calc_psnr(MpiRcStat *stat,MppFrame frame_in,MppFrame frame_out)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  double dVar10;
  RK_U8 *dec_buf_y;
  RK_U8 *enc_buf_y;
  RK_U8 *dec_buf;
  RK_U8 *enc_buf;
  RK_U32 dec_hor_stride;
  RK_U32 enc_hor_stride;
  RK_U32 luma_size;
  RK_U32 height;
  RK_U32 width;
  double psnr_y;
  double mse_y;
  double ssd_y;
  uint local_28;
  RK_S32 tmp;
  RK_U32 y;
  RK_U32 x;
  MppFrame frame_out_local;
  MppFrame frame_in_local;
  MpiRcStat *stat_local;
  
  mse_y = 0.0;
  uVar1 = mpp_frame_get_width(frame_in);
  uVar2 = mpp_frame_get_height(frame_in);
  iVar3 = mpp_frame_get_hor_stride(frame_in);
  iVar4 = mpp_frame_get_hor_stride(frame_out);
  uVar6 = mpp_frame_get_buffer(frame_in);
  lVar7 = mpp_buffer_get_ptr_with_caller(uVar6,"mpi_rc_calc_psnr");
  uVar6 = mpp_frame_get_buffer(frame_out);
  lVar8 = mpp_buffer_get_ptr_with_caller(uVar6,"mpi_rc_calc_psnr");
  for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
    for (tmp = 0; (uint)tmp < uVar1; tmp = tmp + 1) {
      iVar5 = (uint)*(byte *)(lVar7 + (ulong)(tmp + local_28 * iVar3)) -
              (uint)*(byte *)(lVar8 + (ulong)(tmp + local_28 * iVar4));
      mse_y = (double)(iVar5 * iVar5) + mse_y;
    }
  }
  dVar10 = mse_y / ((double)(uVar1 * uVar2) * 65025.0);
  if (1e-10 < dVar10) {
    fVar9 = log10f((float)dVar10);
    _height = (double)fVar9 * -10.0;
  }
  else {
    _height = 100.0;
  }
  stat->psnr_y = _height;
  return;
}

Assistant:

static void mpi_rc_calc_psnr(MpiRcStat *stat, MppFrame frame_in,
                             MppFrame frame_out)
{
    RK_U32 x, y;
    RK_S32 tmp;
    double ssd_y = 0.0;
    double mse_y = 0.0;
    double psnr_y = 0.0;

    RK_U32 width  = mpp_frame_get_width(frame_in);
    RK_U32 height  = mpp_frame_get_height(frame_in);
    RK_U32 luma_size = width * height;
    RK_U32 enc_hor_stride = mpp_frame_get_hor_stride(frame_in);
    RK_U32 dec_hor_stride = mpp_frame_get_hor_stride(frame_out);
    RK_U8 *enc_buf = (RK_U8 *)mpp_buffer_get_ptr(mpp_frame_get_buffer(frame_in));
    RK_U8 *dec_buf = (RK_U8 *)mpp_buffer_get_ptr(mpp_frame_get_buffer(frame_out));
    RK_U8 *enc_buf_y = enc_buf;
    RK_U8 *dec_buf_y = dec_buf;

    for (y = 0 ; y < height; y++) {
        for (x = 0; x < width; x++) {
            tmp = enc_buf_y[x + y * enc_hor_stride] -
                  dec_buf_y[x + y * dec_hor_stride];
            tmp *= tmp;
            ssd_y += tmp;
        }
    }
    // NOTE: should be 65025.0 rather than 65025,
    // because 65025*luma_size may exceed
    // 1 << 32.
    mse_y = ssd_y / (65025.0 * luma_size); // 65025=255*255
    if (mse_y <= 0.0000000001)
        psnr_y = 100;
    else
        psnr_y = -10.0 * log10f(mse_y);

    stat->psnr_y = psnr_y;
}